

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

bool __thiscall ON_StringBuffer::GrowBuffer(ON_StringBuffer *this,size_t buffer_capacity)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  
  if ((this->m_buffer_capacity < buffer_capacity) ||
     ((bVar3 = true, this->m_buffer_capacity != 0 && (this->m_buffer == (char *)0x0)))) {
    pcVar1 = this->m_heap_buffer;
    pcVar2 = (char *)this->m_heap_buffer_capacity;
    if (pcVar1 == (char *)0x0 || pcVar2 < buffer_capacity) {
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      pcVar1 = (char *)operator_new__(buffer_capacity,(nothrow_t *)&std::nothrow);
      this->m_heap_buffer = pcVar1;
      pcVar2 = pcVar1;
      if (pcVar1 != (char *)0x0) {
        pcVar2 = (char *)buffer_capacity;
      }
      this->m_heap_buffer_capacity = (size_t)pcVar2;
    }
    this->m_buffer = pcVar1;
    this->m_buffer_capacity = (size_t)pcVar2;
    bVar3 = buffer_capacity <= pcVar2;
  }
  return bVar3;
}

Assistant:

bool ON_StringBuffer::GrowBuffer(
  size_t buffer_capacity
  )
{
  if (buffer_capacity <= m_buffer_capacity && (nullptr != m_buffer || 0 == m_buffer_capacity))
    return true;

  if (buffer_capacity > m_heap_buffer_capacity || nullptr == m_heap_buffer)
  {
    if (nullptr != m_heap_buffer)
      delete[] m_heap_buffer;
    m_heap_buffer = new(std::nothrow) char[buffer_capacity];
    m_heap_buffer_capacity = (nullptr != m_heap_buffer) ? buffer_capacity : 0;
  }

  m_buffer = m_heap_buffer;
  m_buffer_capacity = m_heap_buffer_capacity;

  return (buffer_capacity <= m_buffer_capacity);
}